

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void add_table(ecs_world_t *world,ecs_query_t *query,ecs_table_t *table)

{
  _Bool _Var1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  ecs_type_t peVar5;
  char *pcVar6;
  ecs_type_t *__dest;
  void *__src;
  ecs_table_event_t local_188;
  long *local_168;
  ecs_table_indices_t *ti;
  char *pcStack_158;
  ecs_size_t ref_size;
  char *type_expr;
  ecs_matched_table_t *table_elem;
  ecs_bitset_column_t *elem;
  ulong uStack_138;
  int32_t bs_index;
  ecs_entity_t bs_id;
  ecs_sparse_column_t *sc;
  ecs_sig_from_kind_t local_120;
  int32_t index;
  ecs_sig_from_kind_t from;
  ecs_sig_oper_kind_t op;
  ecs_entity_t component;
  ecs_entity_t entity;
  ecs_sig_column_t *column;
  ecs_sig_column_t *columns;
  ecs_table_t *local_f0;
  ecs_vector_t *local_a8;
  ecs_vector_t *references;
  ecs_matched_table_t table_data;
  int32_t matched_table_index;
  int32_t table_indices_count;
  int32_t *table_indices;
  trait_offset_t *trait_offsets;
  int32_t trait_count;
  int32_t trait_cur;
  int32_t column_count;
  int32_t c;
  ecs_type_t table_type;
  ecs_table_t *table_local;
  ecs_query_t *query_local;
  ecs_world_t *world_local;
  
  _column_count = (ecs_type_t)0x0;
  iVar2 = ecs_vector_count((query->sig).columns);
  if (table != (ecs_table_t *)0x0) {
    _column_count = table->type;
  }
  trait_offsets._4_4_ = 0;
  iVar3 = count_traits(query,_column_count);
  table_indices = (int32_t *)0x0;
  if (iVar3 != 0) {
    table_indices = (int32_t *)(*ecs_os_api.calloc_)(iVar2 << 3);
  }
  _matched_table_index = (void *)0x0;
  table_data._76_4_ = 0;
  table_data.rank = 0;
  local_a8 = (ecs_vector_t *)0x0;
  do {
    memset(&columns,0,0x50);
    local_f0 = table;
    memcpy(&references,&columns,0x50);
    if (table != (ecs_table_t *)0x0) {
      _column_count = table->type;
    }
    group_table(world,query,(ecs_matched_table_t *)&references);
    if (iVar2 != 0) {
      references = (ecs_vector_t *)(*ecs_os_api.malloc_)(iVar2 << 2);
      _ecs_assert(references != (ecs_vector_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.columns != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2ad);
      if (references == (ecs_vector_t *)0x0) {
        __assert_fail("table_data.iter_data.columns != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2ad,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      table_data.iter_data.data = (ecs_data_t *)(*ecs_os_api.malloc_)(iVar2 << 3);
      _ecs_assert(table_data.iter_data.data != (ecs_data_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.components != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2b2);
      if (table_data.iter_data.data == (ecs_data_t *)0x0) {
        __assert_fail("table_data.iter_data.components != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2b2,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      table_data.iter_data.components = (ecs_entity_t *)(*ecs_os_api.malloc_)(iVar2 << 3);
      _ecs_assert(table_data.iter_data.components != (ecs_entity_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.types != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2b6);
      if (table_data.iter_data.components == (ecs_entity_t *)0x0) {
        __assert_fail("table_data.iter_data.types != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2b6,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
    }
    column = (ecs_sig_column_t *)_ecs_vector_first((query->sig).columns,0x28,0x10);
    for (trait_cur = 0; trait_cur < iVar2; trait_cur = trait_cur + 1) {
      entity = (ecs_entity_t)(column + trait_cur);
      component = 0;
      _from = (ecs_vector_t *)0x0;
      index = ((ecs_sig_column_t *)entity)->oper_kind;
      local_120 = ((ecs_sig_column_t *)entity)->from_kind;
      if (index == EcsOperNot) {
        local_120 = EcsFromEmpty;
      }
      (&references->count)[trait_cur] = 0;
      get_comp_and_src(world,query,_column_count,(ecs_sig_column_t *)entity,index,local_120,
                       (ecs_entity_t *)&from,&component);
      if ((component == 0) && (local_120 != EcsFromEmpty)) {
        sc._4_4_ = get_component_index(world,table,_column_count,(ecs_entity_t *)&from,trait_cur,
                                       index,(trait_offset_t *)table_indices,trait_offsets._4_4_ + 1
                                      );
        if (sc._4_4_ == -1) {
          if ((local_120 == EcsFromOwned) && (index == 3)) {
            sc._4_4_ = 0;
          }
        }
        else if ((local_120 == EcsFromShared) && (index == 3)) {
          sc._4_4_ = 0;
        }
        (&references->count)[trait_cur] = sc._4_4_;
        if (((ulong)_from & 0xff00000000000000) == 0xfc00000000000000) {
          bs_id = (ecs_entity_t)
                  _ecs_vector_add((ecs_vector_t **)&table_data.iter_data.references,0x18,0x10);
          *(int32_t *)(bs_id + 0x10) = trait_cur;
          *(ulong *)(bs_id + 8) = (ulong)_from & 0xffffffffffffff;
          *(undefined8 *)bs_id = 0;
        }
        if ((sc._4_4_ != 0) && ((table->flags & 0x20000) != 0)) {
          uStack_138 = (ulong)_from & 0xffffffffffffff | 0xf400000000000000;
          elem._4_4_ = ecs_type_index_of(table->type,uStack_138);
          if (elem._4_4_ != -1) {
            table_elem = (ecs_matched_table_t *)
                         _ecs_vector_add(&table_data.sparse_columns,0x10,0x10);
            *(int32_t *)&(table_elem->iter_data).table = elem._4_4_;
            (table_elem->iter_data).columns = (int32_t *)0x0;
          }
        }
      }
      if (((component != 0) || ((&references->count)[trait_cur] == -1)) || (local_120 == EcsCascade)
         ) {
        local_a8 = add_ref(world,query,_column_count,local_a8,(ecs_entity_t)_from,component,
                           local_120);
        iVar4 = ecs_vector_count(local_a8);
        (&references->count)[trait_cur] = -iVar4;
      }
      (&(table_data.iter_data.data)->entities)[trait_cur] = _from;
      peVar5 = get_column_type(world,index,(ecs_entity_t)_from);
      table_data.iter_data.components[trait_cur] = (ecs_entity_t)peVar5;
    }
    if ((table == (ecs_table_t *)0x0) || (_Var1 = has_auto_activation(query), !_Var1)) {
      type_expr = (char *)_ecs_vector_add(&query->tables,0x50,0x10);
      iVar4 = ecs_vector_count(query->tables);
      table_data.rank = iVar4 + -1;
      _ecs_assert(-1 < table_data.rank,0xc,(char *)0x0,"matched_table_index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x335);
      if (table_data.rank < 0) {
        __assert_fail("matched_table_index >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x335,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
    }
    else {
      type_expr = (char *)_ecs_vector_add(&query->empty_tables,0x50,0x10);
      table_data.rank = ecs_vector_count(query->empty_tables);
      table_data._76_4_ = table_data._76_4_ + 1;
      _matched_table_index = (*ecs_os_api.realloc_)(_matched_table_index,table_data._76_4_ * 4);
      *(int32_t *)((long)_matched_table_index + (long)(table_data._76_4_ + -1) * 4) =
           -table_data.rank;
      pcStack_158 = ecs_type_str(world,table->type);
      pcVar6 = query_name(world,query);
      _ecs_trace(2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                 ,0x327,"query #[green]%s#[reset] matched with table #[green][%s]",pcVar6,
                 pcStack_158);
      (*ecs_os_api.free_)(pcStack_158);
    }
    if (local_a8 != (ecs_vector_t *)0x0) {
      iVar4 = ecs_vector_count(local_a8);
      ti._4_4_ = iVar4 * 0x30;
      __dest = (ecs_type_t *)(*ecs_os_api.malloc_)(ti._4_4_);
      table_data.iter_data.types = __dest;
      __src = _ecs_vector_first(local_a8,0x30,0x10);
      memcpy(__dest,__src,(long)ti._4_4_);
      ecs_vector_free(local_a8);
      local_a8 = (ecs_vector_t *)0x0;
    }
    memcpy(type_expr,&references,0x50);
    trait_offsets._4_4_ = trait_offsets._4_4_ + 1;
  } while (trait_offsets._4_4_ < iVar3);
  if (_matched_table_index != (void *)0x0) {
    local_168 = (long *)_ecs_map_ensure(query->table_indices,0x10,(ulong)table->id);
    if (*local_168 != 0) {
      (*ecs_os_api.free_)((void *)*local_168);
    }
    *local_168 = (long)_matched_table_index;
    *(undefined4 *)(local_168 + 1) = table_data._76_4_;
  }
  if ((table == (ecs_table_t *)0x0) || ((query->flags & 0x100) != 0)) {
    if ((table != (ecs_table_t *)0x0) && (iVar2 = ecs_table_count(table), iVar2 != 0)) {
      activate_table(world,query,table,true);
    }
  }
  else {
    local_188.kind = EcsTableQueryMatch;
    local_188.matched_table_index = table_data.rank;
    local_188.component = 0;
    local_188.query = query;
    ecs_table_notify(world,table,&local_188);
  }
  if (table_indices != (int32_t *)0x0) {
    (*ecs_os_api.free_)(table_indices);
  }
  return;
}

Assistant:

static
void add_table(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_table_t *table)
{
    ecs_type_t table_type = NULL;
    int32_t c, column_count = ecs_vector_count(query->sig.columns);

    if (table) {
        table_type = table->type;
    }

    int32_t trait_cur = 0, trait_count = count_traits(query, table_type);
    
    /* If the query has traits, we need to account for the fact that a table may
     * have multiple components to which the trait is applied, which means the
     * table has to be registered with the query multiple times, with different
     * table columns. If so, allocate a small array for each trait in which the
     * last added table index of the trait is stored, so that in the next 
     * iteration we can start the search from the correct offset type. */
    trait_offset_t *trait_offsets = NULL;
    if (trait_count) {
        trait_offsets = ecs_os_calloc(
            ECS_SIZEOF(trait_offset_t) * column_count);
    }

    /* From here we recurse */
    int32_t *table_indices = NULL;
    int32_t table_indices_count = 0;
    int32_t matched_table_index = 0;
    ecs_matched_table_t table_data;
    ecs_vector_t *references = NULL;

add_trait:
    table_data = (ecs_matched_table_t){ .iter_data.table = table };
    if (table) {
        table_type = table->type;
    }

    /* If grouping is enabled for query, assign the group rank to the table */
    group_table(world, query, &table_data);

    if (column_count) {
        /* Array that contains the system column to table column mapping */
        table_data.iter_data.columns = ecs_os_malloc(ECS_SIZEOF(int32_t) * column_count);
        ecs_assert(table_data.iter_data.columns != NULL, ECS_OUT_OF_MEMORY, NULL);

        /* Store the components of the matched table. In the case of OR expressions,
        * components may differ per matched table. */
        table_data.iter_data.components = ecs_os_malloc(ECS_SIZEOF(ecs_entity_t) * column_count);
        ecs_assert(table_data.iter_data.components != NULL, ECS_OUT_OF_MEMORY, NULL);

        /* Also cache types, so no lookup is needed while iterating */
        table_data.iter_data.types = ecs_os_malloc(ECS_SIZEOF(ecs_type_t) * column_count);
        ecs_assert(table_data.iter_data.types != NULL, ECS_OUT_OF_MEMORY, NULL);        
    }

    /* Walk columns parsed from the system signature */
    ecs_sig_column_t *columns = ecs_vector_first(
        query->sig.columns, ecs_sig_column_t);

    for (c = 0; c < column_count; c ++) {
        ecs_sig_column_t *column = &columns[c];
        ecs_entity_t entity = 0, component = 0;
        ecs_sig_oper_kind_t op = column->oper_kind;
        ecs_sig_from_kind_t from = column->from_kind;

        if (op == EcsOperNot) {
            from = EcsFromEmpty;
        }

        table_data.iter_data.columns[c] = 0;

        /* Get actual component and component source for current column */
        get_comp_and_src(world, query, table_type, column, op, from, &component, 
            &entity);

        /* This column does not retrieve data from a static entity (either
         * EcsFromSystem or EcsFromParent) and is not just a handle */
        if (!entity && from != EcsFromEmpty) {
            int32_t index = get_component_index(world, table, table_type, 
                &component, c, op, trait_offsets, trait_cur + 1);

            if (index == -1) {
                if (from == EcsFromOwned && op == EcsOperOptional) {
                    index = 0;
                }
            } else {
                if (from == EcsFromShared && op == EcsOperOptional) {
                    index = 0;
                }
            }

            table_data.iter_data.columns[c] = index;

            /* If the column is a case, we should only iterate the entities in
             * the column for this specific case. Add a sparse column with the
             * case id so we can find the correct entities when iterating */
            if (ECS_HAS_ROLE(component, CASE)) {
                ecs_sparse_column_t *sc = ecs_vector_add(
                    &table_data.sparse_columns, ecs_sparse_column_t);
                sc->signature_column_index = c;
                sc->sw_case = component & ECS_COMPONENT_MASK;
                sc->sw_column = NULL;
            }

            /* If table has a disabled bitmask for components, check if there is
             * a disabled column for the queried for component. If so, cache it
             * in a vector as the iterator will need to skip the entity when the
             * component is disabled. */
            if (index && (table->flags & EcsTableHasDisabled)) {
                ecs_entity_t bs_id = 
                    (component & ECS_COMPONENT_MASK) | ECS_DISABLED;
                int32_t bs_index = ecs_type_index_of(table->type, bs_id);
                if (bs_index != -1) {
                    ecs_bitset_column_t *elem = ecs_vector_add(
                        &table_data.bitset_columns, ecs_bitset_column_t);
                    elem->column_index = bs_index;
                    elem->bs_column = NULL;
                }
            }
        }

        /* Check if a the component is a reference. If 'entity' is set, the
         * component must be resolved from another entity, which is the case
         * for FromEntity and FromContainer. 
         * 
         * If no entity is set but the component is not found in the table, it
         * must come from a prefab. This is guaranteed, as at this point it is
         * already validated that the table matches with the system.
         * 
         * If the column from is Cascade, there may not be an entity in case the
         * current table contains root entities. In that case, still add a
         * reference field. The application can, after the table has matched,
         * change the set of components, so that this column will turn into a
         * reference. Having the reference already linked to the system table
         * makes changing this administation easier when the change happens.
         */
        if ((entity || table_data.iter_data.columns[c] == -1 || from == EcsCascade)) {
            references = add_ref(world, query, table_type, references, 
                component, entity, from);
            table_data.iter_data.columns[c] = -ecs_vector_count(references);
        }

        table_data.iter_data.components[c] = component;
        table_data.iter_data.types[c] = get_column_type(world, op, component);
    }

    /* Initially always add table to inactive group. If the system is registered
     * with the table and the table is not empty, the table will send an
     * activate signal to the system. */

    ecs_matched_table_t *table_elem;
    if (table && has_auto_activation(query)) {
        table_elem = ecs_vector_add(&query->empty_tables, 
            ecs_matched_table_t);

        /* Store table index */
        matched_table_index = ecs_vector_count(query->empty_tables);
        table_indices_count ++;
        table_indices = ecs_os_realloc(
            table_indices, table_indices_count * ECS_SIZEOF(int32_t));
        table_indices[table_indices_count - 1] = -matched_table_index;

        #ifndef NDEBUG
        char *type_expr = ecs_type_str(world, table->type);
        ecs_trace_2("query #[green]%s#[reset] matched with table #[green][%s]",
            query_name(world, query), type_expr);
        ecs_os_free(type_expr);
        #endif
    } else {
        /* If no table is provided to function, this is a system that contains
         * no columns that require table matching. In this case, the system will
         * only have one "dummy" table that caches data from the system columns.
         * Always add this dummy table to the list of active tables, since it
         * would never get activated otherwise. */
        table_elem = ecs_vector_add(&query->tables, ecs_matched_table_t);

        /* If query doesn't automatically activates/inactivates tables, we can 
         * get the count to determine the current table index. */
        matched_table_index = ecs_vector_count(query->tables) - 1;
        ecs_assert(matched_table_index >= 0, ECS_INTERNAL_ERROR, NULL);
    }

    if (references) {
        ecs_size_t ref_size = ECS_SIZEOF(ecs_ref_t) * ecs_vector_count(references);
        table_data.iter_data.references = ecs_os_malloc(ref_size);
        ecs_os_memcpy(table_data.iter_data.references, 
            ecs_vector_first(references, ecs_ref_t), ref_size);
        ecs_vector_free(references);
        references = NULL;
    }

    *table_elem = table_data;

    /* Use tail recursion when adding table for multiple traits */
    trait_cur ++;
    if (trait_cur < trait_count) {
        goto add_trait;
    }

    /* Register table indices before sending out the match signal. This signal
     * can cause table activation, and table indices are needed for that. */
    if (table_indices) {
        ecs_table_indices_t *ti = ecs_map_ensure(
            query->table_indices, ecs_table_indices_t, table->id);
        if (ti->indices) {
            ecs_os_free(ti->indices);
        }
        ti->indices = table_indices;
        ti->count = table_indices_count;
    }

    if (table && !(query->flags & EcsQueryIsSubquery)) {
        ecs_table_notify(world, table, &(ecs_table_event_t){
            .kind = EcsTableQueryMatch,
            .query = query,
            .matched_table_index = matched_table_index
        });
    } else if (table && ecs_table_count(table)) {
        activate_table(world, query, table, true);
    }

    if (trait_offsets) {
        ecs_os_free(trait_offsets);
    }
}